

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IterSetOutputsTokendata(Fts5Iter *pIter)

{
  int iVar1;
  Fts5TokenDataIter *pT;
  Fts5Iter *pFVar2;
  Fts5Index *p;
  Fts5PoslistReader *pFVar3;
  Fts5TokenDataMap *pFVar4;
  ulong uVar5;
  u32 nByte;
  ulong uVar6;
  int iVar7;
  long iPos;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long iRowid;
  long lVar11;
  uint uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  i64 iPrev;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pT = pIter->pTokenDataIter;
  (pIter->base).nData = 0;
  (pIter->base).pData = (u8 *)0x0;
  uVar12 = pT->nIter;
  uVar5 = (ulong)uVar12;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar12) {
    uVar10 = (ulong)uVar12;
  }
  iRowid = -0x8000000000000000;
  uVar6 = 0;
  iVar7 = 0;
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    pFVar2 = pT->apIter[uVar9];
    if ((pFVar2->base).bEof == '\0') {
      lVar11 = (pFVar2->base).iRowid;
      if ((iVar7 == 0) || (lVar11 < iRowid)) {
        (pIter->base).pData = (pFVar2->base).pData;
        (pIter->base).nData = (pFVar2->base).nData;
        uVar6 = uVar9 & 0xffffffff;
        iVar7 = 1;
        iRowid = lVar11;
      }
      else {
        iVar7 = iVar7 + (uint)(lVar11 == iRowid);
      }
    }
  }
  if (iVar7 == 0) {
    (pIter->base).bEof = '\x01';
  }
  else {
    p = pIter->pIndex;
    iVar1 = p->pConfig->eDetail;
    (pIter->base).bEof = '\0';
    (pIter->base).iRowid = iRowid;
    if ((iVar7 == 1) && (iVar1 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        fts5TokendataIterAppendMap(p,pT,(int)uVar6,0,iRowid,-1);
        return;
      }
      goto LAB_001c4be2;
    }
    if ((1 < iVar7) && (iVar1 != 1)) {
      iPrev = 0;
      if (pT->aPoslistReader == (Fts5PoslistReader *)0x0) {
        pFVar3 = (Fts5PoslistReader *)sqlite3Fts5MallocZero(&p->rc,(long)(int)uVar12 * 0x24);
        pT->aPoslistReader = pFVar3;
        if (pFVar3 == (Fts5PoslistReader *)0x0) goto LAB_001c49c6;
        uVar5 = (ulong)pT->nIter;
        pT->aPoslistToIter = (int *)(pFVar3 + uVar5);
      }
      iVar8 = 0;
      uVar12 = 0;
      for (lVar11 = 0; lVar11 < (int)uVar5; lVar11 = lVar11 + 1) {
        pFVar2 = pT->apIter[lVar11];
        uVar13 = uVar12;
        if (iRowid == (pFVar2->base).iRowid) {
          pT->aPoslistToIter[(int)uVar12] = (int)lVar11;
          uVar13 = uVar12 + 1;
          sqlite3Fts5PoslistReaderInit
                    ((pFVar2->base).pData,(pFVar2->base).nData,pT->aPoslistReader + (int)uVar12);
          iVar8 = iVar8 + (pFVar2->base).nData;
          uVar5 = (ulong)(uint)pT->nIter;
        }
        uVar12 = uVar13;
      }
      nByte = iVar7 * 10 + iVar8 + (pIter->poslist).n;
      if ((nByte <= (uint)(pIter->poslist).nSpace) ||
         (iVar7 = sqlite3Fts5BufferSize(&pIter->pIndex->rc,&pIter->poslist,nByte), iVar7 == 0)) {
        if ((iVar1 != 0) || (pT->nMap + iVar8 <= pT->nMapAlloc)) {
LAB_001c4ae7:
          (pIter->poslist).n = 0;
          uVar5 = (ulong)uVar12;
          if ((int)uVar12 < 1) {
            uVar5 = 0;
          }
          do {
            uVar9 = 0;
            uVar10 = 0;
            lVar11 = 0x7fffffffffffffff;
            do {
              for (; iPos = lVar11, iVar7 = (int)uVar10, uVar9 != uVar5; uVar9 = uVar9 + 1) {
                if ((pT->aPoslistReader[uVar9].bEof == '\0') &&
                   (lVar11 = pT->aPoslistReader[uVar9].iPos, lVar11 < iPos)) {
                  uVar10 = uVar9 & 0xffffffff;
                  iPos = lVar11;
                }
                lVar11 = iPos;
              }
              if (iPos == 0x7fffffffffffffff) {
                (pIter->base).pData = (pIter->poslist).p;
                (pIter->base).nData = (pIter->poslist).n;
                goto LAB_001c49c6;
              }
              sqlite3Fts5PoslistSafeAppend(&pIter->poslist,&iPrev,iPos);
              sqlite3Fts5PoslistReaderNext(pT->aPoslistReader + iVar7);
              uVar9 = 0;
              uVar10 = 0;
              lVar11 = 0x7fffffffffffffff;
            } while (iVar1 != 0);
            pFVar4 = pT->aMap;
            iVar8 = pT->nMap;
            pFVar4[iVar8].iPos = iPos;
            pFVar4[iVar8].iIter = pT->aPoslistToIter[iVar7];
            pFVar4[iVar8].iRowid = iRowid;
            pT->nMap = iVar8 + 1;
          } while( true );
        }
        iVar8 = pT->nMapAlloc + iVar8;
        pFVar4 = (Fts5TokenDataMap *)sqlite3_realloc(pT->aMap,iVar8 * 0x30);
        if (pFVar4 != (Fts5TokenDataMap *)0x0) {
          pT->aMap = pFVar4;
          pT->nMapAlloc = iVar8 * 2;
          goto LAB_001c4ae7;
        }
        pIter->pIndex->rc = 7;
      }
    }
  }
LAB_001c49c6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001c4be2:
  __stack_chk_fail();
}

Assistant:

static void fts5IterSetOutputsTokendata(Fts5Iter *pIter){
  int ii;
  int nHit = 0;
  i64 iRowid = SMALLEST_INT64;
  int iMin = 0;

  Fts5TokenDataIter *pT = pIter->pTokenDataIter;

  pIter->base.nData = 0;
  pIter->base.pData = 0;

  for(ii=0; ii<pT->nIter; ii++){
    Fts5Iter *p = pT->apIter[ii];
    if( p->base.bEof==0 ){
      if( nHit==0 || p->base.iRowid<iRowid ){
        iRowid = p->base.iRowid;
        nHit = 1;
        pIter->base.pData = p->base.pData;
        pIter->base.nData = p->base.nData;
        iMin = ii;
      }else if( p->base.iRowid==iRowid ){
        nHit++;
      }
    }
  }

  if( nHit==0 ){
    pIter->base.bEof = 1;
  }else{
    int eDetail = pIter->pIndex->pConfig->eDetail;
    pIter->base.bEof = 0;
    pIter->base.iRowid = iRowid;

    if( nHit==1 && eDetail==FTS5_DETAIL_FULL ){
      fts5TokendataIterAppendMap(pIter->pIndex, pT, iMin, 0, iRowid, -1);
    }else
    if( nHit>1 && eDetail!=FTS5_DETAIL_NONE ){
      int nReader = 0;
      int nByte = 0;
      i64 iPrev = 0;

      /* Allocate array of iterators if they are not already allocated. */
      if( pT->aPoslistReader==0 ){
        pT->aPoslistReader = (Fts5PoslistReader*)sqlite3Fts5MallocZero(
            &pIter->pIndex->rc,
            pT->nIter * (sizeof(Fts5PoslistReader) + sizeof(int))
        );
        if( pT->aPoslistReader==0 ) return;
        pT->aPoslistToIter = (int*)&pT->aPoslistReader[pT->nIter];
      }

      /* Populate an iterator for each poslist that will be merged */
      for(ii=0; ii<pT->nIter; ii++){
        Fts5Iter *p = pT->apIter[ii];
        if( iRowid==p->base.iRowid ){
          pT->aPoslistToIter[nReader] = ii;
          sqlite3Fts5PoslistReaderInit(
              p->base.pData, p->base.nData, &pT->aPoslistReader[nReader++]
          );
          nByte += p->base.nData;
        }
      }

      /* Ensure the output buffer is large enough */
      if( fts5BufferGrow(&pIter->pIndex->rc, &pIter->poslist, nByte+nHit*10) ){
        return;
      }

      /* Ensure the token-mapping is large enough */
      if( eDetail==FTS5_DETAIL_FULL && pT->nMapAlloc<(pT->nMap + nByte) ){
        int nNew = (pT->nMapAlloc + nByte) * 2;
        Fts5TokenDataMap *aNew = (Fts5TokenDataMap*)sqlite3_realloc(
            pT->aMap, nNew*sizeof(Fts5TokenDataMap)
        );
        if( aNew==0 ){
          pIter->pIndex->rc = SQLITE_NOMEM;
          return;
        }
        pT->aMap = aNew;
        pT->nMapAlloc = nNew;
      }

      pIter->poslist.n = 0;

      while( 1 ){
        i64 iMinPos = LARGEST_INT64;

        /* Find smallest position */
        iMin = 0;
        for(ii=0; ii<nReader; ii++){
          Fts5PoslistReader *pReader = &pT->aPoslistReader[ii];
          if( pReader->bEof==0 ){
            if( pReader->iPos<iMinPos ){
              iMinPos = pReader->iPos;
              iMin = ii;
            }
          }
        }

        /* If all readers were at EOF, break out of the loop. */
        if( iMinPos==LARGEST_INT64 ) break;

        sqlite3Fts5PoslistSafeAppend(&pIter->poslist, &iPrev, iMinPos);
        sqlite3Fts5PoslistReaderNext(&pT->aPoslistReader[iMin]);

        if( eDetail==FTS5_DETAIL_FULL ){
          pT->aMap[pT->nMap].iPos = iMinPos;
          pT->aMap[pT->nMap].iIter = pT->aPoslistToIter[iMin];
          pT->aMap[pT->nMap].iRowid = iRowid;
          pT->nMap++;
        }
      }

      pIter->base.pData = pIter->poslist.p;
      pIter->base.nData = pIter->poslist.n;
    }
  }
}